

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 4_multi_catch.cpp
# Opt level: O2

int main(void)

{
  f();
  return 0;
}

Assistant:

int main() try // Function try block
{
   f();
	return EXIT_SUCCESS;
}
catch (...)
{
   // Define a separate exception handler un-related to 'loggingHandler' to handle various exceptions.
   using namespace mittens;
   return   all_catcher(             -1, []()                        { std::cout << "Caught unhandled exception of unknown type!"   << std::endl; }, 
               std_exception_handler(-2, [](std::exception&e)        { std::cout << "Caught unhandled std::exception: " << e.what() << std::endl; },
                  bad_alloc_handler( 0xBadA110c, [](std::bad_alloc&e){ std::cout << "Caught unhandled std::bad_alloc: " << e.what() << std::endl; }))).
                     handleException(); 
}